

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mylinkedList.h
# Opt level: O0

linkedList<transaction_*> * __thiscall
linkedList<transaction_*>::operator=(linkedList<transaction_*> *this,linkedList<transaction_*> *rhs)

{
  bool bVar1;
  transaction **pptVar2;
  transaction *item;
  undefined1 local_40 [8];
  Iterator __end0;
  Iterator __begin0;
  linkedList<transaction_*> *__range1;
  linkedList<transaction_*> *rhs_local;
  linkedList<transaction_*> *this_local;
  
  clear(this);
  begin((linkedList<transaction_*> *)&__end0.currPtr);
  end((linkedList<transaction_*> *)local_40);
  while( true ) {
    bVar1 = Iterator::operator!=((Iterator *)&__end0.currPtr,(Iterator *)local_40);
    if (!bVar1) break;
    pptVar2 = Iterator::operator*((Iterator *)&__end0.currPtr);
    insert_last(this,*pptVar2);
    Iterator::operator++((Iterator *)&__end0.currPtr);
  }
  Iterator::~Iterator((Iterator *)local_40);
  Iterator::~Iterator((Iterator *)&__end0.currPtr);
  this->size = rhs->size;
  return this;
}

Assistant:

linkedList<T> &  linkedList<T>::operator=(  linkedList<T> &rhs)
{

//        linkedList *tmp = new linkedList;

    this->clear(); // the function at the start of this review

//        if (rhs.isEmpty()) {
//            // short cut, since the other list is empty
//            linkedList<T> tmp = new linkedList<T>();
//            this = tmp;
//            return *this;
//        }


    for ( auto item : rhs) {
        this->insert_last(item);
    }
    this->size = rhs.size; //peritto

    return *this;

}